

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

bool __thiscall
dg::vr::RelationsAnalyzer::canShift
          (RelationsAnalyzer *this,ValueRelations *graph,V param,Type shift)

{
  long lVar1;
  _Base_ptr p_Var2;
  pointer ppVVar3;
  Value *pVVar4;
  V lt;
  StructureAnalyzer *this_00;
  V val_00;
  bool bVar5;
  uint uVar6;
  VectorSet<const_llvm::Value_*> *pVVar7;
  _Base_ptr p_Var8;
  Function *func;
  undefined1 auVar9 [8];
  V rt;
  Relations RVar10;
  ulong uVar11;
  Value **val;
  pointer ppVVar12;
  V local_88;
  _Base_bitset<1UL> local_80;
  RelationsAnalyzer *local_78;
  ulong local_70;
  ValueRelations *local_68;
  undefined1 local_60 [8];
  _Rb_tree_node_base local_58;
  
  lVar1 = *(long *)param;
  local_88 = param;
  bVar5 = ValueRelations::has<llvm::Value_const*>(graph,&local_88,(Relations)0xfff);
  if ((!bVar5) || (*(char *)(*(long *)local_88 + 8) != '\r')) {
    return false;
  }
  local_80._M_w = 0;
  uVar11 = (ulong)shift;
  if (shift < (UGE|ULE)) {
    local_80._M_w = 1L << ((byte)shift & 0x3f);
    local_78 = this;
    uVar6 = dg::vr::Relations::getNonStrict(shift);
    uVar11 = (ulong)uVar6;
    if (uVar6 < 0xc) {
      local_80._M_w = local_80._M_w | 1L << ((byte)uVar6 & 0x3f);
      ValueRelations::getRelated<llvm::Value_const*>
                ((RelationsMap *)local_60,graph,&local_88,(Relations *)&local_80);
      if (local_58._M_left != &local_58) {
        local_70 = 1L << ((byte)shift & 0x3f);
        p_Var8 = local_58._M_left;
        local_68 = graph;
        do {
          p_Var2 = p_Var8[1]._M_parent;
          pVVar7 = ValueRelations::getEqual(local_68,*(Handle *)(p_Var8 + 1));
          ppVVar12 = (pVVar7->vec).
                     super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppVVar3 = (pVVar7->vec).
                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (ppVVar12 != ppVVar3) {
            uVar11 = (ulong)p_Var2 & local_70;
            do {
              pVVar4 = *ppVVar12;
              if (((char)*(uint *)(*(long *)pVVar4 + 8) == '\r') &&
                 (*(uint *)(*(long *)pVVar4 + 8) >> 8 <= *(uint *)(lVar1 + 8) >> 8)) {
                if (uVar11 != 0) {
LAB_0011e463:
                  std::
                  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                  ::_M_erase((_Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                              *)local_60,(_Link_type)local_58._M_parent);
                  return true;
                }
                if (pVVar4[0x10] == (Value)0x10) {
                  if (shift == SLT) {
                    bVar5 = llvm::APInt::isMaxSignedValue((APInt *)(pVVar4 + 0x18));
                  }
                  else {
                    if (shift != SGT) goto LAB_0011e463;
                    bVar5 = llvm::APInt::isMinSignedValue((APInt *)(pVVar4 + 0x18));
                  }
                  if (!bVar5) goto LAB_0011e463;
                }
              }
              ppVVar12 = ppVVar12 + 1;
            } while (ppVVar12 != ppVVar3);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
          graph = local_68;
        } while (p_Var8 != &local_58);
      }
      std::
      _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
      ::_M_erase((_Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                  *)local_60,(_Link_type)local_58._M_parent);
      val_00 = local_88;
      if (local_88 == (V)0x0) {
        return false;
      }
      if ((byte)local_88[0x10] < 0x1b) {
        return false;
      }
      func = (Function *)llvm::Instruction::getFunction();
      ValueRelations::getEqual((VectorSet<const_llvm::Value_*> *)local_60,graph,val_00);
      bVar5 = false;
      auVar9 = local_60;
      do {
        if (auVar9 == (undefined1  [8])local_58._0_8_) {
LAB_0011e4c4:
          if (local_60 != (undefined1  [8])0x0) {
            operator_delete((void *)local_60,(long)local_58._M_parent - (long)local_60);
          }
          if (auVar9 == (undefined1  [8])local_58._0_8_) {
            return false;
          }
          return bVar5;
        }
        lt = *(V *)auVar9;
        if (((lt != (V)0x0) && (lt[0x10] == (Value)0x14)) && ((*(Type **)lt)[8] == (Type)0xd)) {
          rt = (V)llvm::ConstantInt::get(*(Type **)lt,0,false);
          RVar10 = ValueRelations::_between(graph,lt,rt);
          this_00 = *(StructureAnalyzer **)(local_78 + 0x40);
          if (((ulong)RVar10.bits.super__Base_bitset<1UL>._M_w & 2) != 0) {
            shift = dg::vr::Relations::getNonStrict(shift);
          }
          StructureAnalyzer::addPrecondition(this_00,func,(Argument *)lt,shift,rt);
          bVar5 = true;
          goto LAB_0011e4c4;
        }
        auVar9 = (undefined1  [8])((long)auVar9 + 8);
      } while( true );
    }
  }
  std::__throw_out_of_range_fmt
            ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar11,0xc);
}

Assistant:

bool RelationsAnalyzer::canShift(const ValueRelations &graph, V param,
                                 Relations::Type shift) {
    const auto *paramType = param->getType();
    assert(Relations::isStrict(shift) && Relations::isSigned(shift));
    if (!graph.hasAnyRelation(param) || !param->getType()->isIntegerTy())
        return false;

    // if there is a value lesser/greater with same or smaller range, then param
    // is also inc/decrementable
    for (auto pair : graph.getRelated(
                 param,
                 Relations().set(shift).set(Relations::getNonStrict(shift)))) {
        for (const auto &val : graph.getEqual(pair.first)) {
            const auto *valType = val->getType();
            if (valType->isIntegerTy() &&
                valType->getIntegerBitWidth() <=
                        paramType->getIntegerBitWidth()) {
                if (pair.second.has(shift))
                    return true;
                assert(pair.second.has(Relations::getNonStrict(shift)));
                if (const auto *c = llvm::dyn_cast<llvm::ConstantInt>(val)) {
                    if (!(shift == Relations::SGT && c->isMinValue(true)) &&
                        !(shift == Relations::SLT && c->isMaxValue(true)))
                        return true;
                }
            }
        }
    }

    // if the shifted value is a parameter, it depends on the passed value;
    // check when validating
    if (const auto *paramInst = llvm::dyn_cast<llvm::Instruction>(param)) {
        const llvm::Function *thisFun = paramInst->getFunction();

        for (const auto *val : graph.getEqual(paramInst)) {
            if (const auto *arg = llvm::dyn_cast<llvm::Argument>(val)) {
                if (arg->getType()->isIntegerTy()) {
                    const auto *zero =
                            llvm::ConstantInt::get(arg->getType(), 0);
                    if (graph.are(arg, Relations::NE, zero))
                        structure.addPrecondition(
                                thisFun, arg, Relations::getNonStrict(shift),
                                zero);
                    else
                        structure.addPrecondition(thisFun, arg, shift, zero);
                    return true;
                }
            }
        }
    }
    return false;
}